

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  uint8_t description;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t consumed;
  size_t *local_88;
  st_ptls_record_message_emitter_t emitter;
  ptls_buffer_t local_50;
  
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x12e1,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  emitter.super.enc = &(tls->traffic_protection).enc;
  emitter.super.record_header_length = 5;
  emitter.super.begin_message = begin_record_message;
  emitter.super.commit_message = commit_record_message;
  emitter.rec_start = 0;
  emitter.super.buf = _sendbuf;
  if (tls->state == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12e9,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    if (*tls->ctx->key_exchanges == (ptls_key_exchange_algorithm_t *)0x0) {
      __assert_fail("tls->ctx->key_exchanges[0] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x12ea,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    uVar2 = send_client_hello(tls,&emitter.super,properties,(ptls_iovec_t *)0x0);
  }
  else {
    sVar1 = _sendbuf->off;
    pvVar4 = (void *)(*inlen + (long)input);
    local_50.base = "";
    local_50.is_allocated = 0;
    local_50.capacity = 0;
    local_50.off = 0;
    uVar2 = 0x202;
    local_88 = inlen;
    for (; (uVar2 == 0x202 && (input != pvVar4)); input = (void *)((long)input + consumed)) {
      consumed = (long)pvVar4 - (long)input;
      uVar2 = handle_input(tls,&emitter.super,&local_50,input,&consumed,properties);
      if (local_50.off != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x12fc,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
    }
    ptls_buffer_dispose(&local_50);
    if ((uVar2 != 0) && ((uVar2 != 0x202 && (uVar2 != 0x206)))) {
      (*ptls_clear_memory)((emitter.super.buf)->base + sVar1,(emitter.super.buf)->off - sVar1);
      (emitter.super.buf)->off = sVar1;
      if ((uVar2 & 0xffffff00) != 0x100) {
        description = 'P';
        if ((uVar2 & 0xffffff00) == 0) {
          description = (uint8_t)uVar2;
        }
        iVar3 = ptls_send_alert(tls,emitter.super.buf,'\x02',description);
        if (iVar3 != 0) {
          (emitter.super.buf)->off = sVar1;
        }
      }
    }
    *local_88 = (long)input + (*local_88 - (long)pvVar4);
  }
  return uVar2;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        assert(tls->ctx->key_exchanges[0] != NULL);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
        break;
    default:
        /* flush partially written response */
        ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
        emitter.super.buf->off = sendbuf_orig_off;
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}